

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Omega_h_map.cpp
# Opt level: O0

Read<signed_char> __thiscall Omega_h::invert_marks(Omega_h *this,Read<signed_char> *marks)

{
  void *extraout_RDX;
  Read<signed_char> RVar1;
  Write<signed_char> local_c8;
  undefined1 local_b8 [8];
  type f;
  allocator local_81;
  string local_80 [32];
  undefined1 local_60 [8];
  Write<signed_char> out;
  Read<signed_char> *marks_local;
  LO local_20;
  LO local_10;
  
  if (((ulong)(marks->write_).shared_alloc_.alloc & 1) == 0) {
    local_10 = (LO)((marks->write_).shared_alloc_.alloc)->size;
  }
  else {
    local_10 = (LO)((ulong)(marks->write_).shared_alloc_.alloc >> 3);
  }
  out.shared_alloc_.direct_ptr = marks;
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_80,"",&local_81);
  Write<signed_char>::Write((Write<signed_char> *)local_60,local_10,(string *)local_80);
  std::__cxx11::string::~string(local_80);
  std::allocator<char>::~allocator((allocator<char> *)&local_81);
  Write<signed_char>::Write((Write<signed_char> *)local_b8,(Write<signed_char> *)local_60);
  Read<signed_char>::Read((Read<signed_char> *)&f.out.shared_alloc_.direct_ptr,marks);
  if (((ulong)local_60 & 1) == 0) {
    local_20 = (LO)*(size_t *)local_60;
  }
  else {
    local_20 = (LO)((ulong)local_60 >> 3);
  }
  parallel_for<Omega_h::invert_marks(Omega_h::Read<signed_char>)::__0>
            (local_20,(type *)local_b8,"invert_marks");
  Write<signed_char>::Write(&local_c8,(Write<signed_char> *)local_60);
  Read<signed_char>::Read((Read<signed_char> *)this,&local_c8);
  Write<signed_char>::~Write(&local_c8);
  invert_marks(Omega_h::Read<signed_char>)::$_0::~__0((__0 *)local_b8);
  Write<signed_char>::~Write((Write<signed_char> *)local_60);
  RVar1.write_.shared_alloc_.direct_ptr = extraout_RDX;
  RVar1.write_.shared_alloc_.alloc = (Alloc *)this;
  return (Read<signed_char>)RVar1.write_.shared_alloc_;
}

Assistant:

Read<I8> invert_marks(Read<I8> marks) {
  Write<I8> out(marks.size());
  auto f = OMEGA_H_LAMBDA(LO i) { out[i] = !marks[i]; };
  parallel_for(out.size(), f, "invert_marks");
  return out;
}